

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

void __thiscall OpenMD::Component::Component(Component *this)

{
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_60;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Component_002bdad0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->Type);
  (this->NMol).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->NMol).super_ParameterBase.keyword_.field_2;
  (this->NMol).super_ParameterBase.keyword_._M_string_length = 0;
  (this->NMol).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->NMol).super_ParameterBase.optional_ = false;
  (this->NMol).super_ParameterBase.defaultValue_ = false;
  local_38 = &(this->NMol).super_ParameterBase;
  (this->NMol).super_ParameterBase.empty_ = true;
  (this->NMol).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bbc88;
  (this->Region).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Region).super_ParameterBase.keyword_.field_2;
  (this->Region).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Region).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Region).super_ParameterBase.optional_ = false;
  (this->Region).super_ParameterBase.defaultValue_ = false;
  (this->Region).super_ParameterBase.empty_ = true;
  (this->Region).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bbc88;
  this->moleculeStamp_ = (MoleculeStamp *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"type",(allocator<char> *)&local_80);
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"type",&local_81);
  local_60.first._M_string_length = local_78;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_60.first.field_2;
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ = local_70._8_8_;
    local_60.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = &(this->Type).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"nMol",(allocator<char> *)&local_80);
  std::__cxx11::string::_M_assign((string *)&(this->NMol).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"nMol",&local_81);
  local_60.first._M_string_length = local_78;
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ = local_70._8_8_;
    local_60.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60.second = local_38;
  local_80 = &local_70;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"region",(allocator<char> *)&local_80);
  std::__cxx11::string::_M_assign((string *)&(this->Region).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"region",&local_81);
  local_60.first._M_string_length = local_78;
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ = local_70._8_8_;
    local_60.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = &(this->Region).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

Component::Component() : moleculeStamp_(NULL) {
    DefineParameter(Type, "type");
    DefineParameter(NMol, "nMol");
    DefineParameter(Region, "region");
  }